

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha1.c
# Opt level: O2

int SHA1FinalBits(SHA1Context *context,uint8_t message_bits,uint length)

{
  uint32_t *puVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  
  if (length == 0) {
    iVar4 = 0;
  }
  else if (context == (SHA1Context *)0x0) {
    iVar4 = 1;
  }
  else if ((length < 8) && (context->Computed == 0)) {
    iVar4 = context->Corrupted;
    if (iVar4 == 0) {
      iVar4 = 0;
      puVar1 = &context->Length_Low;
      uVar2 = *puVar1;
      *puVar1 = *puVar1 + length;
      uVar3 = 0;
      if (CARRY4(uVar2,length)) {
        puVar1 = &context->Length_High;
        *puVar1 = *puVar1 + 1;
        uVar3 = (uint)(*puVar1 == 0);
      }
      context->Corrupted = uVar3;
      SHA1Finalize(context,message_bits & (&DAT_0011be00)[length] | (&DAT_0011be08)[length]);
    }
  }
  else {
    context->Corrupted = 3;
    iVar4 = 3;
  }
  return iVar4;
}

Assistant:

int SHA1FinalBits(SHA1Context *context, const uint8_t message_bits,
    unsigned int length)
{
    uint32_t addTemp;

    uint8_t masks[8] = {
        /* 0 0b00000000 */ 0x00, /* 1 0b10000000 */ 0x80,
        /* 2 0b11000000 */ 0xC0, /* 3 0b11100000 */ 0xE0,
        /* 4 0b11110000 */ 0xF0, /* 5 0b11111000 */ 0xF8,
        /* 6 0b11111100 */ 0xFC, /* 7 0b11111110 */ 0xFE
    };
    uint8_t markbit[8] = {
        /* 0 0b10000000 */ 0x80, /* 1 0b01000000 */ 0x40,
        /* 2 0b00100000 */ 0x20, /* 3 0b00010000 */ 0x10,
        /* 4 0b00001000 */ 0x08, /* 5 0b00000100 */ 0x04,
        /* 6 0b00000010 */ 0x02, /* 7 0b00000001 */ 0x01
    };

    if (!length)
        return shaSuccess;

    if (!context)
        return shaNull;

    if (context->Computed || (length >= 8) || (length == 0)) {
        context->Corrupted = shaStateError;
        return shaStateError;
    }

    if (context->Corrupted)
        return context->Corrupted;

    SHA1AddLength(context, length);
    SHA1Finalize(context,
        (uint8_t)((message_bits & masks[length]) | markbit[length]));

    return shaSuccess;
}